

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.cpp
# Opt level: O2

void duckdb::NumericStats::TemplatedVerify<long>
               (BaseStatistics *stats,Vector *vector,SelectionVector *sel,idx_t count)

{
  int64_t iVar1;
  InternalException *pIVar2;
  idx_t iVar3;
  idx_t iVar4;
  allocator local_1a9;
  Vector *local_1a8;
  BaseStatistics *local_1a0;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  UnifiedVectorFormat vdata;
  Value max_value;
  Value min_value;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
  Vector::ToUnifiedFormat(vector,count,&vdata);
  MinOrNull(&min_value,stats);
  local_1a8 = vector;
  local_1a0 = stats;
  MaxOrNull(&max_value,stats);
  iVar3 = 0;
  do {
    if (count == iVar3) {
      Value::~Value(&max_value);
      Value::~Value(&min_value);
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
      return;
    }
    iVar4 = iVar3;
    if (sel->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)sel->sel_vector[iVar3];
    }
    if ((vdata.sel)->sel_vector != (sel_t *)0x0) {
      iVar4 = (idx_t)(vdata.sel)->sel_vector[iVar4];
    }
    if ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
         (unsigned_long *)0x0) ||
       ((vdata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar4 >> 6] >>
         (iVar4 & 0x3f) & 1) != 0)) {
      if (min_value.is_null == false) {
        iVar1 = Value::GetValueUnsafe<long>(&min_value);
        if (*(long *)(vdata.data + iVar4 * 8) < iVar1) {
          pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_198,
                     "Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
                     &local_1a9);
          BaseStatistics::ToString_abi_cxx11_(&local_118,local_1a0);
          Vector::ToString_abi_cxx11_(&local_138,local_1a8,count);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar2,&local_198,&local_118,&local_138);
          __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
      if (max_value.is_null == false) {
        iVar1 = Value::GetValueUnsafe<long>(&max_value);
        if (iVar1 < *(long *)(vdata.data + iVar4 * 8)) {
          pIVar2 = (InternalException *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_198,
                     "Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
                     &local_1a9);
          BaseStatistics::ToString_abi_cxx11_(&local_158,local_1a0);
          Vector::ToString_abi_cxx11_(&local_178,local_1a8,count);
          InternalException::InternalException<std::__cxx11::string,std::__cxx11::string>
                    (pIVar2,&local_198,&local_158,&local_178);
          __cxa_throw(pIVar2,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void NumericStats::TemplatedVerify(const BaseStatistics &stats, Vector &vector, const SelectionVector &sel,
                                   idx_t count) {
	UnifiedVectorFormat vdata;
	vector.ToUnifiedFormat(count, vdata);

	auto data = UnifiedVectorFormat::GetData<T>(vdata);
	auto min_value = NumericStats::MinOrNull(stats);
	auto max_value = NumericStats::MaxOrNull(stats);
	for (idx_t i = 0; i < count; i++) {
		auto idx = sel.get_index(i);
		auto index = vdata.sel->get_index(idx);
		if (!vdata.validity.RowIsValid(index)) {
			continue;
		}
		if (!min_value.IsNull() && LessThan::Operation(data[index], min_value.GetValueUnsafe<T>())) { // LCOV_EXCL_START
			throw InternalException("Statistics mismatch: value is smaller than min.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		} // LCOV_EXCL_STOP
		if (!max_value.IsNull() && GreaterThan::Operation(data[index], max_value.GetValueUnsafe<T>())) {
			throw InternalException("Statistics mismatch: value is bigger than max.\nStatistics: %s\nVector: %s",
			                        stats.ToString(), vector.ToString(count));
		}
	}
}